

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O2

MPP_RET vpu_api_mlvec_check_cfg(void *p)

{
  uint uVar1;
  MPP_RET MVar2;
  char *pcVar3;
  
  if (p == (void *)0x0) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input\n","vpu_api_mlvec_check_cfg");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    uVar1 = *(uint *)((long)p + 0x34) & 0xffff0000;
    MVar2 = -(uint)(uVar1 != 0x4d300000);
    if ((vpu_api_debug._2_1_ & 2) != 0) {
      pcVar3 = "success";
      if (uVar1 != 0x4d300000) {
        pcVar3 = "failed";
      }
      _mpp_log_l(4,"vpu_api_mlvec","check mlvec cfg magic %08x %s\n","vpu_api_mlvec_check_cfg",
                 *(uint *)((long)p + 0x34),pcVar3);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET vpu_api_mlvec_check_cfg(void *p)
{
    if (NULL == p) {
        mpp_err_f("invalid NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    VpuApiMlvecStaticCfg *cfg = (VpuApiMlvecStaticCfg *)p;
    RK_U32 magic = cfg->magic;
    MPP_RET ret = MPP_OK;

    if ((((magic >> 24) & 0xff) != MLVEC_MAGIC) ||
        (((magic >> 16) & 0xff) != MLVEC_VERSION))
        ret = MPP_NOK;

    mlvec_dbg_flow("check mlvec cfg magic %08x %s\n", magic,
                   (ret == MPP_OK) ? "success" : "failed");

    return ret;
}